

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idl_gen_python.cpp
# Opt level: O0

void __thiscall
flatbuffers::python::PythonGenerator::InitializeFromBuf
          (PythonGenerator *this,StructDef *struct_def,string *code_ptr)

{
  string local_278;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_258;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_238;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_218;
  string local_1f8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1d8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1b8;
  string local_198;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_178;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_158;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_138;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_118;
  string local_f8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d8;
  string local_b8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_98;
  undefined1 local_68 [8];
  string struct_type;
  string struct_var;
  string *code;
  string *code_ptr_local;
  StructDef *struct_def_local;
  PythonGenerator *this_local;
  
  IdlNamer::Variable_abi_cxx11_((string *)((long)&struct_type.field_2 + 8),&this->namer_,struct_def)
  ;
  IdlNamer::Type_abi_cxx11_((string *)local_68,&this->namer_,struct_def);
  GenIndents_abi_cxx11_(&local_b8,this,1);
  std::operator+(&local_98,&local_b8,"@classmethod");
  std::__cxx11::string::operator+=((string *)code_ptr,(string *)&local_98);
  std::__cxx11::string::~string((string *)&local_98);
  std::__cxx11::string::~string((string *)&local_b8);
  GenIndents_abi_cxx11_(&local_f8,this,1);
  std::operator+(&local_d8,&local_f8,"def InitFromBuf(cls, buf, pos):");
  std::__cxx11::string::operator+=((string *)code_ptr,(string *)&local_d8);
  std::__cxx11::string::~string((string *)&local_d8);
  std::__cxx11::string::~string((string *)&local_f8);
  GenIndents_abi_cxx11_(&local_198,this,2);
  std::operator+(&local_178,&local_198,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 ((long)&struct_type.field_2 + 8));
  std::operator+(&local_158,&local_178," = ");
  std::operator+(&local_138,&local_158,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_68);
  std::operator+(&local_118,&local_138,"()");
  std::__cxx11::string::operator+=((string *)code_ptr,(string *)&local_118);
  std::__cxx11::string::~string((string *)&local_118);
  std::__cxx11::string::~string((string *)&local_138);
  std::__cxx11::string::~string((string *)&local_158);
  std::__cxx11::string::~string((string *)&local_178);
  std::__cxx11::string::~string((string *)&local_198);
  GenIndents_abi_cxx11_(&local_1f8,this,2);
  std::operator+(&local_1d8,&local_1f8,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 ((long)&struct_type.field_2 + 8));
  std::operator+(&local_1b8,&local_1d8,".Init(buf, pos)");
  std::__cxx11::string::operator+=((string *)code_ptr,(string *)&local_1b8);
  std::__cxx11::string::~string((string *)&local_1b8);
  std::__cxx11::string::~string((string *)&local_1d8);
  std::__cxx11::string::~string((string *)&local_1f8);
  GenIndents_abi_cxx11_(&local_278,this,2);
  std::operator+(&local_258,&local_278,"return cls.InitFromObj(");
  std::operator+(&local_238,&local_258,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 ((long)&struct_type.field_2 + 8));
  std::operator+(&local_218,&local_238,")");
  std::__cxx11::string::operator+=((string *)code_ptr,(string *)&local_218);
  std::__cxx11::string::~string((string *)&local_218);
  std::__cxx11::string::~string((string *)&local_238);
  std::__cxx11::string::~string((string *)&local_258);
  std::__cxx11::string::~string((string *)&local_278);
  std::__cxx11::string::operator+=((string *)code_ptr,"\n");
  std::__cxx11::string::~string((string *)local_68);
  std::__cxx11::string::~string((string *)(struct_type.field_2._M_local_buf + 8));
  return;
}

Assistant:

void InitializeFromBuf(const StructDef &struct_def,
                         std::string *code_ptr) const {
    auto &code = *code_ptr;
    const auto struct_var = namer_.Variable(struct_def);
    const auto struct_type = namer_.Type(struct_def);

    code += GenIndents(1) + "@classmethod";
    code += GenIndents(1) + "def InitFromBuf(cls, buf, pos):";
    code += GenIndents(2) + struct_var + " = " + struct_type + "()";
    code += GenIndents(2) + struct_var + ".Init(buf, pos)";
    code += GenIndents(2) + "return cls.InitFromObj(" + struct_var + ")";
    code += "\n";
  }